

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O1

ZyanStatus
ZydisFormatterIntelPrintDISP
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZydisDecodedOperand *pZVar2;
  ZyanUSize ZVar3;
  void *pvVar4;
  ZyanU64 ZVar5;
  ZyanStatus ZVar6;
  ZyanStringView *pZVar7;
  ZyanBool force_leading_number;
  ZyanU64 ZVar8;
  ZyanStringView *pZVar9;
  undefined1 uVar10;
  ZyanUSize ZVar11;
  ulong uVar12;
  ZyanBool uppercase;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14a,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14b,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x14c,
                  "ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (formatter->disp_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
    pZVar2 = context->operand;
    if (-1 < (pZVar2->field_10).mem.disp.value) goto LAB_001227be;
    if (((pZVar2->field_10).mem.base != ZYDIS_REGISTER_NONE) ||
       ((pZVar2->field_10).mem.index != ZYDIS_REGISTER_NONE)) {
      if (buffer->is_token_list == '\0') {
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_00122af1;
        ZVar3 = (buffer->string).vector.size;
        if (ZVar3 == 0) goto LAB_00122b10;
        uVar12 = (buffer->string).vector.capacity;
        ZVar6 = 0x80100009;
        if (ZVar3 + 1 <= uVar12) {
          *(undefined2 *)((long)(buffer->string).vector.data + (ZVar3 - 1)) = 0x2d;
          ZVar11 = (buffer->string).vector.size;
          pvVar4 = (buffer->string).vector.data;
          (buffer->string).vector.size = ZVar11 + 1;
          ZVar6 = 0x100000;
          if (*(char *)((long)pvVar4 + ZVar11) != '\0') goto LAB_00122b2f;
        }
        if (uVar12 < ZVar3 + 1) {
          return ZVar6;
        }
      }
      else {
        ZVar3 = (buffer->string).vector.size;
        if (0xfe < ZVar3 - 1) goto LAB_00122ad2;
        uVar12 = buffer->capacity;
        ZVar6 = 0x80100009;
        if (ZVar3 + 4 < uVar12) {
          pvVar4 = (buffer->string).vector.data;
          *(char *)((long)pvVar4 + -1) = (char)ZVar3;
          *(undefined4 *)((long)pvVar4 + ZVar3) = 0x2d0002;
          ZVar11 = buffer->capacity - (ZVar3 + 2);
          buffer->capacity = ZVar11;
          ppvVar1 = &(buffer->string).vector.data;
          *ppvVar1 = (void *)((long)*ppvVar1 + ZVar3 + 2);
          (buffer->string).vector.size = 2;
          if (0xfe < ZVar11) {
            ZVar11 = 0xff;
          }
          (buffer->string).vector.capacity = ZVar11;
          ZVar6 = 0x100000;
        }
        if (uVar12 <= ZVar3 + 4) {
          return ZVar6;
        }
      }
    }
    if ((buffer->is_token_list != '\0') &&
       (ZVar6 = ZydisFormatterBufferAppend(buffer,'\n'), (int)ZVar6 < 0)) {
      return ZVar6;
    }
    uVar12 = (ulong)formatter->disp_base;
    if (uVar12 == 1) {
      ZVar5 = (context->operand->field_10).mem.disp.value;
      ZVar8 = -ZVar5;
      if (0 < (long)ZVar5) {
        ZVar8 = ZVar5;
      }
      uVar10 = (undefined1)formatter->disp_padding;
      force_leading_number = formatter->hex_force_leading_number;
      uppercase = formatter->hex_uppercase;
      pZVar9 = formatter->number_format[1][0].string;
      pZVar7 = formatter->number_format[1][1].string;
      goto LAB_00122a50;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar5 = (context->operand->field_10).mem.disp.value;
    ZVar8 = -ZVar5;
    if (0 < (long)ZVar5) {
      ZVar8 = ZVar5;
    }
    uVar10 = (undefined1)formatter->disp_padding;
    pZVar9 = formatter->number_format[uVar12][0].string;
    pZVar7 = formatter->number_format[uVar12][1].string;
  }
  else {
    if (formatter->disp_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
      return 0x80100004;
    }
LAB_001227be:
    if (((context->operand->field_10).mem.base != ZYDIS_REGISTER_NONE) ||
       ((context->operand->field_10).mem.index != ZYDIS_REGISTER_NONE)) {
      if (buffer->is_token_list == '\0') {
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_00122af1:
          __assert_fail("!destination->vector.allocator",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xeb,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
        ZVar3 = (buffer->string).vector.size;
        if (ZVar3 == 0) {
LAB_00122b10:
          __assert_fail("destination->vector.size && source->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xec,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
        uVar12 = (buffer->string).vector.capacity;
        ZVar6 = 0x80100009;
        if (ZVar3 + 1 <= uVar12) {
          *(undefined2 *)((long)(buffer->string).vector.data + (ZVar3 - 1)) = 0x2b;
          ZVar11 = (buffer->string).vector.size;
          pvVar4 = (buffer->string).vector.data;
          (buffer->string).vector.size = ZVar11 + 1;
          ZVar6 = 0x100000;
          if (*(char *)((long)pvVar4 + ZVar11) != '\0') {
LAB_00122b2f:
            __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                          ,0xf7,
                          "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                         );
          }
        }
        if (uVar12 < ZVar3 + 1) {
          return ZVar6;
        }
      }
      else {
        ZVar3 = (buffer->string).vector.size;
        if (0xfe < ZVar3 - 1) {
LAB_00122ad2:
          __assert_fail("(len > 0) && (len < 256)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                        ,0xe7,
                        "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                       );
        }
        uVar12 = buffer->capacity;
        ZVar6 = 0x80100009;
        if (ZVar3 + 4 < uVar12) {
          pvVar4 = (buffer->string).vector.data;
          *(char *)((long)pvVar4 + -1) = (char)ZVar3;
          *(undefined4 *)((long)pvVar4 + ZVar3) = 0x2b0002;
          ZVar11 = buffer->capacity - (ZVar3 + 2);
          buffer->capacity = ZVar11;
          ppvVar1 = &(buffer->string).vector.data;
          *ppvVar1 = (void *)((long)*ppvVar1 + ZVar3 + 2);
          (buffer->string).vector.size = 2;
          if (0xfe < ZVar11) {
            ZVar11 = 0xff;
          }
          (buffer->string).vector.capacity = ZVar11;
          ZVar6 = 0x100000;
        }
        if (uVar12 <= ZVar3 + 4) {
          return ZVar6;
        }
      }
    }
    if ((buffer->is_token_list != '\0') &&
       (ZVar6 = ZydisFormatterBufferAppend(buffer,'\n'), (int)ZVar6 < 0)) {
      return ZVar6;
    }
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar8 = (context->operand->field_10).mem.disp.value;
      uVar10 = (undefined1)formatter->disp_padding;
      force_leading_number = formatter->hex_force_leading_number;
      uppercase = formatter->hex_uppercase;
      pZVar9 = formatter->number_format[1][0].string;
      pZVar7 = formatter->number_format[1][1].string;
LAB_00122a50:
      ZVar6 = ZydisStringAppendHexU
                        (&buffer->string,ZVar8,uVar10,force_leading_number,uppercase,pZVar9,pZVar7);
      goto LAB_00122a5c;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar8 = (context->operand->field_10).mem.disp.value;
    uVar10 = (undefined1)formatter->disp_padding;
    pZVar9 = formatter->number_format[0][0].string;
    pZVar7 = formatter->number_format[0][1].string;
  }
  ZVar6 = ZydisStringAppendDecU(&buffer->string,ZVar8,uVar10,pZVar9,pZVar7);
LAB_00122a5c:
  if (-1 < (int)ZVar6) {
    ZVar6 = 0x100000;
  }
  return ZVar6;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintDISP(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    switch (formatter->disp_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        if (context->operand->mem.disp.value < 0)
        {
            if ((context->operand->mem.base  != ZYDIS_REGISTER_NONE) ||
                (context->operand->mem.index != ZYDIS_REGISTER_NONE))
            {
                ZYDIS_BUFFER_APPEND(buffer, SUB);
            }
            ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
            ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
                ZyanAbsI64(context->operand->mem.disp.value), formatter->disp_padding,
                formatter->hex_force_leading_number);
            break;
        }
        ZYAN_FALLTHROUGH;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        if ((context->operand->mem.base  != ZYDIS_REGISTER_NONE) ||
            (context->operand->mem.index != ZYDIS_REGISTER_NONE))
        {
            ZYDIS_BUFFER_APPEND(buffer, ADD);
        }
        ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding,
            formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}